

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

shared_ptr<Image> __thiscall Image::fromPNG(Image *this,string *file_name)

{
  Pixel *pPVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint uVar3;
  runtime_error *this_00;
  shared_ptr<Image> sVar4;
  
  std::make_shared<Image>();
  pPVar1 = this->pixels;
  uVar3 = lodepng::decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pPVar1 + 2),
                          (uint *)(pPVar1 + 8),(uint *)(pPVar1 + 9),file_name,LCT_RGBA,8);
  _Var2._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this->pixels + 2);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this->pixels = _Var2._M_pi;
  if (uVar3 == 0) {
    sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
    sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<Image>)sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Could not load image.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Image> Image::fromPNG(const std::string &file_name) {

  auto img = std::make_shared<Image>();

  // Use lodepng to decode a PNG file
  unsigned int err = lodepng::decode(img->raw, img->width, img->height, file_name, LCT_RGBA);

  // Set the pixel pointer to the start of the raw buffer
  img->pixels = reinterpret_cast<Pixel *>(img->raw.data());

  if (err) {
    throw std::runtime_error("Could not load image.");
  }

  return img;
}